

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O2

void Am_To_Bottom(Am_Object *object)

{
  bool bVar1;
  int value;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  long *plVar4;
  ostream *poVar5;
  Am_Object owner;
  Am_Value_List components;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object current;
  Am_Slot local_28;
  
  bVar1 = Am_Object::Valid(object);
  if (!bVar1) {
    Am_Error("** Am_To_Bottom called with (0L) object\n");
  }
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)object);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    Am_Object::Am_Object(&local_38,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(object,&local_38);
    Am_Object::~Am_Object(&local_38);
    if (bVar1) {
      Am_Object::Make_Unique(&owner,0x82);
      Am_Value_List::Am_Value_List(&components);
      pAVar2 = Am_Object::Get(&owner,0x82,0);
      Am_Value_List::operator=(&components,pAVar2);
      pAVar2 = Am_Object::Get(object,0x85,0);
      value = Am_Value::operator_cast_to_int(pAVar2);
      if (value != 0) {
        Am_Value_List::Start(&components);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(object);
        Am_Value_List::Member(&components,pAVar3);
        Am_Value_List::Delete(&components,false);
        current.data = (Am_Object_Data *)0x0;
        while( true ) {
          bVar1 = Am_Value_List::First(&components);
          if (bVar1) break;
          pAVar2 = Am_Value_List::Get(&components);
          Am_Object::operator=(&current,pAVar2);
          Am_Object::Set(&current,0x85,value,0);
          value = value + -1;
          Am_Value_List::Prev(&components);
        }
        Am_Object::Set(object,0x85,0,0);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(object);
        Am_Value_List::Add(&components,pAVar3,Am_HEAD,false);
        Am_Object::Note_Changed(&owner,0x82);
        local_28 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)object,0x69);
        Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_repaint,0,&local_28);
        Am_Object::~Am_Object(&current);
      }
      Am_Value_List::~Am_Value_List(&components);
    }
    else {
      Am_Object::Am_Object(&local_40,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(object,&local_40);
      Am_Object::~Am_Object(&local_40);
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"** Am_To_Bottom: Attempt to lower ");
        poVar5 = operator<<(poVar5,object);
        poVar5 = std::operator<<(poVar5," which is not a graphical object or window");
        std::endl<char,std::char_traits<char>>(poVar5);
        Am_Error();
      }
      pAVar2 = Am_Object::Get(object,0x7d2,0);
      plVar4 = (long *)Am_Value::operator_cast_to_void_(pAVar2);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x30))(plVar4,0);
      }
    }
  }
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

void
Am_To_Bottom(Am_Object object)
{
  if (!object.Valid())
    Am_Error("** Am_To_Bottom called with (0L) object\n");
  Am_Object owner = object.Get_Owner();
  if (!owner.Valid())
    return;
  if (object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    Am_Value_List components;
    components = owner.Get(Am_GRAPHICAL_PARTS);
    int rank = object.Get(Am_RANK);
    if (rank != 0) {
      components.Start();
      components.Member(object);
      components.Delete(false);
      Am_Object current;
      while (!components.First()) {
        current = components.Get();
        current.Set(Am_RANK, rank);
        --rank;
        components.Prev();
      }
      object.Set(Am_RANK, 0);
      components.Add(object, Am_HEAD, false);
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
      Main_Demon_Queue.Enqueue(
          graphics_repaint, 0,
          ((Am_Object_Advanced &)object).Get_Slot(Am_VISIBLE));
    }
  } else if (object.Is_Instance_Of(Am_Window)) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(object.Get(Am_DRAWONABLE));
    if (draw)
      draw->Lower_Window(nullptr);
  } else {
    std::cerr << "** Am_To_Bottom: Attempt to lower " << object
              << " which is not "
                 "a graphical object or window"
              << std::endl;
    Am_Error();
  }
}